

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

bool GetAuthCookie(string *cookie_out)

{
  byte bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  path filepath;
  string cookie;
  ifstream file;
  undefined4 in_stack_fffffffffffffd78;
  openmode in_stack_fffffffffffffd7c;
  undefined6 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  bool local_259;
  undefined1 in_stack_fffffffffffffdaf;
  string local_230 [32];
  istream local_210 [520];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::ifstream::ifstream(local_210);
  std::__cxx11::string::string(in_stack_fffffffffffffd90);
  GetAuthCookieFile((bool)in_stack_fffffffffffffdaf);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (path *)CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80)),
             in_stack_fffffffffffffd7c);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_259 = false;
  }
  else {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_230);
    std::ifstream::close();
    if (in_RDI != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80)));
    }
    local_259 = true;
  }
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::ifstream::~ifstream(local_210);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_259;
  }
  __stack_chk_fail();
}

Assistant:

bool GetAuthCookie(std::string *cookie_out)
{
    std::ifstream file;
    std::string cookie;
    fs::path filepath = GetAuthCookieFile();
    file.open(filepath);
    if (!file.is_open())
        return false;
    std::getline(file, cookie);
    file.close();

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}